

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O1

AppendResult __thiscall
metaf::TrendGroup::append
          (TrendGroup *this,string *group,ReportPart reportPart,ReportMetadata *reportMetadata)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Probability PVar4;
  optional<metaf::TrendGroup> nextGroup;
  _Storage<metaf::TrendGroup,_true> local_5c;
  char local_14;
  
  if (this->t == NOSIG) {
    return NOT_APPENDED;
  }
  parse((optional<metaf::TrendGroup> *)&local_5c._M_value,group,reportPart,reportMetadata);
  if (local_14 != '\x01') {
    return NOT_APPENDED;
  }
  PVar4 = this->prob;
  if (((((PVar4 != NONE && this->t == PROB) &&
        (((this->tFrom).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
          super__Optional_payload_base<metaf::MetafTime>._M_engaged & 1U) == 0)) &&
       (((this->tTill).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
         super__Optional_payload_base<metaf::MetafTime>._M_engaged & 1U) == 0)) &&
      (((((this->tAt).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
          super__Optional_payload_base<metaf::MetafTime>._M_engaged & 1U) == 0 &&
        (local_5c._M_value.t - BECMG < 3)) &&
       ((local_5c._M_value.prob == NONE &&
        (((local_5c._28_4_ & 1) == 0 && (BECMG < (uint)local_5c._0_4_)))))))) &&
     (((local_5c._48_4_ & 1) == 0 && ((local_5c._68_4_ & 1) == 0)))) {
    this->t = local_5c._M_value.t;
    return APPENDED;
  }
  if (2 < this->t - BECMG) goto LAB_001a5a15;
  if ((((local_5c._M_value.t != TIME_SPAN) || (local_5c._M_value.isTafTimeSpanGroup != true)) ||
      (local_5c._M_value.prob != NONE)) ||
     ((((local_5c._28_4_ & 1) == 0 || ((local_5c._48_4_ & 1) == 0)) || ((local_5c._68_4_ & 1) != 0))
     )) {
    if ((2 < local_5c._M_value.t - FROM) || (local_5c._M_value.prob != NONE)) goto LAB_001a5a15;
    if ((local_5c._28_4_ & 1) == 0) {
      if (((local_5c._48_4_ & 1) == 0) && ((local_5c._68_4_ & 1) == 0)) goto LAB_001a5a15;
    }
    else if (((local_5c._48_4_ & 1) != 0) || ((local_5c._68_4_ & 1) != 0)) goto LAB_001a5a15;
    if (((local_5c._48_4_ & 1) != 0) && ((local_5c._68_4_ & 1) != 0)) goto LAB_001a5a15;
  }
  bVar1 = (this->tFrom).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
          super__Optional_payload_base<metaf::MetafTime>._M_engaged;
  if ((((bVar1 & 1U) == 0) || ((local_5c._28_4_ & 1) == 0)) &&
     ((((bVar2 = (this->tTill).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
                 super__Optional_payload_base<metaf::MetafTime>._M_engaged, (bVar2 & 1U) == 0 ||
        ((local_5c._48_4_ & 1) == 0)) &&
       ((bVar3 = (this->tAt).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
                 super__Optional_payload_base<metaf::MetafTime>._M_engaged, (bVar3 & 1U) == 0 ||
        ((((local_5c._68_4_ & 1) == 0 && ((local_5c._28_4_ & 1) == 0)) &&
         ((local_5c._48_4_ & 1) == 0)))))) &&
      (((bVar2 | bVar1) &
        local_5c._M_value.tAt.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
        super__Optional_payload_base<metaf::MetafTime>._M_engaged & 1U) == 0)))) {
    if ((bVar1 & 1U) == 0) {
      *(undefined4 *)
       &(this->tFrom).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
        super__Optional_payload_base<metaf::MetafTime>._M_engaged = local_5c._28_4_;
      (this->tFrom).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
      super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.dayValue.
      super__Optional_base<unsigned_int,_true,_true>._M_payload =
           (_Optional_payload<unsigned_int,_true,_true,_true>)local_5c._12_8_;
      *(undefined8 *)
       ((long)&(this->tFrom).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
               super__Optional_payload_base<metaf::MetafTime>._M_payload + 8) = local_5c._20_8_;
    }
    if ((bVar2 & 1U) == 0) {
      *(undefined4 *)
       &(this->tTill).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
        super__Optional_payload_base<metaf::MetafTime>._M_engaged = local_5c._48_4_;
      (this->tTill).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
      super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.dayValue.
      super__Optional_base<unsigned_int,_true,_true>._M_payload =
           (_Optional_payload<unsigned_int,_true,_true,_true>)local_5c._32_8_;
      *(undefined8 *)
       ((long)&(this->tTill).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
               super__Optional_payload_base<metaf::MetafTime>._M_payload + 8) = local_5c._40_8_;
    }
    if ((bVar3 & 1U) == 0) {
      *(undefined4 *)
       &(this->tAt).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
        super__Optional_payload_base<metaf::MetafTime>._M_engaged = local_5c._68_4_;
      (this->tAt).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
      super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.dayValue.
      super__Optional_base<unsigned_int,_true,_true>._M_payload =
           (_Optional_payload<unsigned_int,_true,_true,_true>)local_5c._52_8_;
      *(undefined8 *)
       ((long)&(this->tAt).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
               super__Optional_payload_base<metaf::MetafTime>._M_payload + 8) = local_5c._60_8_;
      return APPENDED;
    }
    return APPENDED;
  }
LAB_001a5a15:
  if (((this->t == PROB && PVar4 != NONE) &&
      (((this->tFrom).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
        super__Optional_payload_base<metaf::MetafTime>._M_engaged & 1U) == 0)) &&
     ((((((this->tTill).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
          super__Optional_payload_base<metaf::MetafTime>._M_engaged & 1U) == 0 &&
        ((((this->tAt).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::MetafTime>._M_engaged & 1U) == 0 &&
         (local_5c._M_value.t == TIME_SPAN)))) && (local_5c._M_value.isTafTimeSpanGroup == true)) &&
      ((((local_5c._M_value.prob == NONE && ((local_5c._28_4_ & 1) != 0)) &&
        ((local_5c._48_4_ & 1) != 0)) && ((local_5c._68_4_ & 1) == 0)))))) {
    *(undefined4 *)
     &(this->tFrom).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
      super__Optional_payload_base<metaf::MetafTime>._M_engaged = local_5c._28_4_;
    (this->tFrom).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
    super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.dayValue.
    super__Optional_base<unsigned_int,_true,_true>._M_payload =
         (_Optional_payload<unsigned_int,_true,_true,_true>)local_5c._12_8_;
    *(undefined8 *)
     ((long)&(this->tFrom).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::MetafTime>._M_payload + 8) = local_5c._20_8_;
    (this->tTill).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
    super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.dayValue.
    super__Optional_base<unsigned_int,_true,_true>._M_payload =
         (_Optional_payload<unsigned_int,_true,_true,_true>)local_5c._32_8_;
    *(undefined8 *)
     ((long)&(this->tTill).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::MetafTime>._M_payload + 8) = local_5c._40_8_;
    *(undefined4 *)
     &(this->tTill).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
      super__Optional_payload_base<metaf::MetafTime>._M_engaged = local_5c._48_4_;
    *(undefined4 *)
     &(this->tAt).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
      super__Optional_payload_base<metaf::MetafTime>._M_engaged = local_5c._68_4_;
    (this->tAt).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
    super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.dayValue.
    super__Optional_base<unsigned_int,_true,_true>._M_payload =
         (_Optional_payload<unsigned_int,_true,_true,_true>)local_5c._52_8_;
    *(undefined8 *)
     ((long)&(this->tAt).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::MetafTime>._M_payload + 8) = local_5c._60_8_;
    this->t = TIME_SPAN;
    return APPENDED;
  }
  bVar1 = this->t != FROM;
  if (local_5c._M_value.t == UNTIL && (PVar4 == NONE && !bVar1)) {
    this->t = TIME_SPAN;
    (this->tTill).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
    super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.dayValue.
    super__Optional_base<unsigned_int,_true,_true>._M_payload =
         (_Optional_payload<unsigned_int,_true,_true,_true>)local_5c._32_8_;
    *(undefined8 *)
     ((long)&(this->tTill).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::MetafTime>._M_payload + 8) = local_5c._40_8_;
    *(undefined4 *)
     &(this->tTill).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
      super__Optional_payload_base<metaf::MetafTime>._M_engaged = local_5c._48_4_;
  }
  return (uint)(local_5c._M_value.t != UNTIL || (PVar4 != NONE || bVar1));
}

Assistant:

AppendResult TrendGroup::append(const std::string & group,
	ReportPart reportPart,
	const ReportMetadata & reportMetadata)
{
	(void)reportMetadata;
	if (type() == Type::NOSIG) return AppendResult::NOT_APPENDED;
	const auto nextGroup = parse(group, reportPart, reportMetadata);
	if (!nextGroup.has_value()) return AppendResult::NOT_APPENDED;
	if (combineProbAndTrendTypeGroups(*nextGroup)) return AppendResult::APPENDED;
	if (combineTrendTypeAndTimeGroup(*nextGroup)) return AppendResult::APPENDED;
	if (combineProbAndTimeSpanGroups(*nextGroup)) return AppendResult::APPENDED;
	if (combineIncompleteGroups(*nextGroup)) return AppendResult::APPENDED;
	return AppendResult::NOT_APPENDED;
}